

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

Role __thiscall QAccessibleButton::role(QAccessibleButton *this)

{
  bool bVar1;
  QPushButton *this_00;
  QMenu *pQVar2;
  QPushButton *pb;
  QAbstractButton *ab;
  Role local_4;
  
  button((QAccessibleButton *)0x7ee327);
  this_00 = qobject_cast<QPushButton*>((QObject *)0x7ee336);
  if ((this_00 == (QPushButton *)0x0) ||
     (pQVar2 = QPushButton::menu(this_00), pQVar2 == (QMenu *)0x0)) {
    bVar1 = QAbstractButton::isCheckable(&this_00->super_QAbstractButton);
    if (bVar1) {
      bVar1 = QAbstractButton::autoExclusive(&this_00->super_QAbstractButton);
      local_4 = CheckBox;
      if (bVar1) {
        local_4 = RadioButton;
      }
    }
    else {
      local_4 = Button;
    }
  }
  else {
    local_4 = ButtonMenu;
  }
  return local_4;
}

Assistant:

QAccessible::Role QAccessibleButton::role() const
{
    QAbstractButton *ab = button();

#if QT_CONFIG(menu)
    if (QPushButton *pb = qobject_cast<QPushButton*>(ab)) {
        if (pb->menu())
            return QAccessible::ButtonMenu;
    }
#endif

    if (ab->isCheckable())
        return ab->autoExclusive() ? QAccessible::RadioButton : QAccessible::CheckBox;

    return QAccessible::Button;
}